

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher_manager.cc
# Opt level: O3

void __thiscall
iqxmlrpc::Method_dispatcher_manager::push_back
          (Method_dispatcher_manager *this,Method_dispatcher_base *mdisp)

{
  iterator *piVar1;
  Impl *this_00;
  _Elt_pointer ppMVar2;
  Method_dispatcher_base *local_8;
  
  this_00 = this->impl_;
  ppMVar2 = (this_00->dispatchers).
            super__Deque_base<iqxmlrpc::Method_dispatcher_base_*,_std::allocator<iqxmlrpc::Method_dispatcher_base_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppMVar2 ==
      (this_00->dispatchers).
      super__Deque_base<iqxmlrpc::Method_dispatcher_base_*,_std::allocator<iqxmlrpc::Method_dispatcher_base_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    local_8 = mdisp;
    std::deque<iqxmlrpc::Method_dispatcher_base*,std::allocator<iqxmlrpc::Method_dispatcher_base*>>
    ::_M_push_back_aux<iqxmlrpc::Method_dispatcher_base*const&>
              ((deque<iqxmlrpc::Method_dispatcher_base*,std::allocator<iqxmlrpc::Method_dispatcher_base*>>
                *)this_00,&local_8);
  }
  else {
    *ppMVar2 = mdisp;
    piVar1 = &(this_00->dispatchers).
              super__Deque_base<iqxmlrpc::Method_dispatcher_base_*,_std::allocator<iqxmlrpc::Method_dispatcher_base_*>_>
              ._M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  return;
}

Assistant:

void Method_dispatcher_manager::push_back(Method_dispatcher_base* mdisp)
{
  impl_->dispatchers.push_back(mdisp);
}